

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

int buf_append(buf_t *buf,void *data,unsigned_long len)

{
  uint __line;
  int iVar1;
  char *__assertion;
  
  if (buf == (buf_t *)0x0) {
    __assertion = "buf != NULL";
    __line = 0x2a;
  }
  else if (buf->data == (uchar *)0x0) {
    __assertion = "buf->data != NULL";
    __line = 0x2b;
  }
  else if (data == (void *)0x0) {
    __assertion = "data != NULL";
    __line = 0x2c;
  }
  else {
    if (len != 0) {
      do {
        if (buf->len + len <= buf->size) {
          memcpy(buf->data + buf->len,data,len);
          buf->len = buf->len + len;
          return 1;
        }
        iVar1 = buf_grow(buf);
      } while (iVar1 != 0);
      return 0;
    }
    __assertion = "len > 0";
    __line = 0x2d;
  }
  __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/buf.c",
                __line,"int buf_append(buf_t *, void *, unsigned long)");
}

Assistant:

int buf_append(buf_t *buf, void *data, unsigned long len) {
  assert(buf != NULL);
  assert(buf->data != NULL);
  assert(data != NULL);
  assert(len > 0);

 again:
  if ((buf->len + len) > buf->size) {
    if (!buf_grow(buf))
      return 0;
    else
      goto again;
  }

  memcpy(buf->data + buf->len, data, len);
  buf->len += len;

  return 1;
}